

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O3

void __thiscall Highs::invalidateModelStatusSolutionAndInfo(Highs *this)

{
  this->model_status_ = kMin;
  (this->info_).super_HighsInfoStruct.primal_solution_status = 0;
  (this->info_).super_HighsInfoStruct.dual_solution_status = 0;
  (this->info_).super_HighsInfoStruct.num_primal_infeasibilities = -1;
  (this->info_).super_HighsInfoStruct.max_primal_infeasibility = INFINITY;
  (this->info_).super_HighsInfoStruct.sum_primal_infeasibilities = INFINITY;
  (this->info_).super_HighsInfoStruct.num_dual_infeasibilities = -1;
  (this->info_).super_HighsInfoStruct.max_dual_infeasibility = INFINITY;
  (this->info_).super_HighsInfoStruct.sum_dual_infeasibilities = INFINITY;
  HighsSolution::invalidate(&this->solution_);
  HighsRanging::invalidate(&this->ranging_);
  HighsInfo::invalidate(&this->info_);
  HighsIis::invalidate(&this->iis_);
  return;
}

Assistant:

void Highs::invalidateModelStatusSolutionAndInfo() {
  invalidateModelStatus();
  invalidateSolution();
  invalidateRanging();
  invalidateInfo();
  invalidateIis();
}